

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O0

size_t sk_net_write(Socket *sock,void *buf,size_t len)

{
  size_t sVar1;
  NetSocket *s;
  size_t len_local;
  void *buf_local;
  Socket *sock_local;
  
  if (*(int *)((long)&sock[-8].vt + 4) == 0) {
    bufchain_add((bufchain *)(sock + -0xf),buf,len);
    if (((ulong)sock[-10].vt & 0x100) != 0) {
      try_send((NetSocket *)(sock + -0x12));
    }
    uxsel_tell((NetSocket *)(sock + -0x12));
    sVar1 = bufchain_size((bufchain *)(sock + -0xf));
    return sVar1;
  }
  __assert_fail("s->outgoingeof == EOF_NO",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/network.c",
                0x4a8,"size_t sk_net_write(Socket *, const void *, size_t)");
}

Assistant:

static size_t sk_net_write(Socket *sock, const void *buf, size_t len)
{
    NetSocket *s = container_of(sock, NetSocket, sock);

    assert(s->outgoingeof == EOF_NO);

    /*
     * Add the data to the buffer list on the socket.
     */
    bufchain_add(&s->output_data, buf, len);

    /*
     * Now try sending from the start of the buffer list.
     */
    if (s->writable)
        try_send(s);

    /*
     * Update the select() status to correctly reflect whether or
     * not we should be selecting for write.
     */
    uxsel_tell(s);

    return bufchain_size(&s->output_data);
}